

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeDataCount(WasmBinaryWriter *this)

{
  BufferWithRandomAccess *this_00;
  bool bVar1;
  size_type sVar2;
  U32LEB local_18;
  int32_t local_14;
  WasmBinaryWriter *pWStack_10;
  int32_t start;
  WasmBinaryWriter *this_local;
  
  pWStack_10 = this;
  bVar1 = FeatureSet::hasBulkMemory(&this->wasm->features);
  if ((bVar1) &&
     (sVar2 = std::
              vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ::size(&this->wasm->dataSegments), sVar2 != 0)) {
    local_14 = startSection<wasm::BinaryConsts::Section>(this,DataCount);
    this_00 = this->o;
    sVar2 = std::
            vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ::size(&this->wasm->dataSegments);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_18,(uint)sVar2);
    BufferWithRandomAccess::operator<<(this_00,local_18);
    finishSection(this,local_14);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeDataCount() {
  if (!wasm->features.hasBulkMemory() || !wasm->dataSegments.size()) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::DataCount);
  o << U32LEB(wasm->dataSegments.size());
  finishSection(start);
}